

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_list3(sexp ctx,sexp a,sexp b,sexp c)

{
  sexp psVar1;
  sexp_sint_t n;
  sexp local_38;
  sexp_gc_var_t local_30;
  
  local_30.var = &local_38;
  local_38 = (sexp)0x43e;
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  local_38 = sexp_list2(ctx,b,c);
  psVar1 = sexp_cons_op(ctx,b,n,a,local_38);
  (ctx->value).context.saves = local_30.next;
  return psVar1;
}

Assistant:

sexp sexp_list3 (sexp ctx, sexp a, sexp b, sexp c) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_list2(ctx, b, c);
  res = sexp_cons(ctx, a, res);
  sexp_gc_release1(ctx);
  return res;
}